

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.cpp
# Opt level: O0

void funcinfo(lua_Debug *ar,Closure *cl)

{
  Proto *pPVar1;
  char *pcVar2;
  TString *local_28;
  Proto *p;
  Closure *cl_local;
  lua_Debug *ar_local;
  
  if ((cl == (Closure *)0x0) || ((cl->c).tt == '&')) {
    ar->source = "=[C]";
    ar->linedefined = -1;
    ar->lastlinedefined = -1;
    ar->what = "C";
  }
  else {
    pPVar1 = (cl->l).p;
    if (pPVar1->source == (TString *)0x0) {
      local_28 = (TString *)0x1315bb;
    }
    else {
      local_28 = pPVar1->source + 1;
    }
    ar->source = (char *)local_28;
    ar->linedefined = pPVar1->linedefined;
    ar->lastlinedefined = pPVar1->lastlinedefined;
    pcVar2 = "Lua";
    if (ar->linedefined == 0) {
      pcVar2 = "main";
    }
    ar->what = pcVar2;
  }
  luaO_chunkid(ar->short_src,ar->source,0x3c);
  return;
}

Assistant:

static void funcinfo (lua_Debug *ar, Closure *cl) {
  if (noLuaClosure(cl)) {
    ar->source = "=[C]";
    ar->linedefined = -1;
    ar->lastlinedefined = -1;
    ar->what = "C";
  }
  else {
    Proto *p = cl->l.p;
    ar->source = p->source ? getstr(p->source) : "=?";
    ar->linedefined = p->linedefined;
    ar->lastlinedefined = p->lastlinedefined;
    ar->what = (ar->linedefined == 0) ? "main" : "Lua";
  }
  luaO_chunkid(ar->short_src, ar->source, LUA_IDSIZE);
}